

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(int lhs,SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *this;
  longlong in_RSI;
  int in_EDI;
  int ret;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  int *in_stack_ffffffffffffffb8;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
  *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar2;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_00;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  int local_14;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_10;
  longlong local_8;
  
  local_14 = in_EDI;
  local_10.m_int = in_RSI;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_20);
  rhs_00.m_int = local_10.m_int;
  bVar1 = DivisionCornerCaseHelper<long_long,_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::DivisionCornerCase1(local_14,local_10,&local_20);
  if (bVar1) {
    local_8 = local_20.m_int;
  }
  else {
    bVar1 = DivisionCornerCaseHelper2<long_long,_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
            ::DivisionCornerCase2
                      ((int)((ulong)local_10.m_int >> 0x20),rhs_00,
                       (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (bVar1) {
      local_8 = local_20.m_int;
    }
    else {
      uVar2 = 0;
      this = (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             SafeInt::operator_cast_to_long_long(in_stack_ffffffffffffffc0);
      DivisionHelper<int,_long_long,_5>::
      DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
                ((int *)local_10.m_int,(longlong *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                 (int *)this);
      SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (this,in_stack_ffffffffffffffb8);
    }
  }
  return (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_8;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}